

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ParseResult * read_object(ParseResult *__return_storage_ptr__,istream *is)

{
  parse_result_t pVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ast_type_t aVar5;
  ParseResult *pPVar6;
  char cVar7;
  string *psVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  shared_ptr<ASTNode> local_1d8;
  string local_1c0;
  string oct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  ParseResult result;
  string charname;
  string local_f0;
  undefined8 local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::make_shared<ASTNode>();
  skip_whitespace(is);
  iVar3 = std::istream::get();
  charname._M_dataplus._M_p = (pointer)&charname.field_2;
  charname._M_string_length = 0;
  result.error._M_dataplus._M_p = (pointer)&result.error.field_2;
  result.result = END;
  result.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  result.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  result.error._M_string_length = 0;
  charname.field_2._M_local_buf[0] = '\0';
  result.error.field_2._M_local_buf[0] = '\0';
  switch(iVar3) {
  case 0x22:
    (local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = STRING;
    iVar3 = std::istream::get();
    do {
      if (iVar3 == 0x5c) {
        uVar4 = std::istream::get();
        cVar7 = (char)local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (uVar4 == 0x66) {
          cVar7 = cVar7 + '\b';
          goto LAB_0011264b;
        }
        if (uVar4 == 0x74) {
          cVar7 = cVar7 + '\b';
          goto LAB_0011264b;
        }
        if (uVar4 == 0x6e) {
          cVar7 = cVar7 + '\b';
          goto LAB_0011264b;
        }
        if ((uVar4 & 0xfffffff8) != 0x30) goto LAB_00112643;
        oct._M_dataplus._M_p = (pointer)&oct.field_2;
        oct._M_string_length = 0;
        oct.field_2._M_local_buf[0] = '\0';
        iVar3 = 3;
        while( true ) {
          iVar3 = iVar3 + -1;
          cVar7 = (char)&oct;
          if (iVar3 == 0) break;
          std::__cxx11::string::push_back(cVar7);
          uVar4 = std::istream::get();
          if ((uVar4 & 0xfffffff8) != 0x30) {
            std::operator+(&local_168,"Invalid escape sequence: \\",&oct);
            std::operator+(&local_1c0,&local_168,(char)uVar4);
            ParseResult::ParseResult(__return_storage_ptr__,&local_1c0);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_168);
            goto LAB_00112a96;
          }
        }
        std::__cxx11::string::push_back(cVar7);
        std::__cxx11::string::push_back
                  ((char)local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                   '\b');
        std::__cxx11::string::~string((string *)&oct);
      }
      else {
        if (iVar3 == -1) {
          std::__cxx11::string::string
                    ((string *)&oct,"Unclosed string literal",(allocator *)&local_1c0);
          ParseResult::ParseResult(__return_storage_ptr__,&oct);
          goto LAB_00112a96;
        }
        if (iVar3 == 0x22) goto LAB_00112a69;
LAB_00112643:
        cVar7 = (char)local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                '\b';
LAB_0011264b:
        std::__cxx11::string::push_back(cVar7);
      }
      iVar3 = std::istream::get();
    } while( true );
  case 0x23:
    iVar3 = std::istream::get();
    iVar3 = tolower(iVar3);
    if (iVar3 == 0x21) {
      std::__cxx11::string::assign
                ((char *)&(local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->value);
      iVar3 = std::istream::get();
      goto switchD_0011260d_caseD_24;
    }
    if ((iVar3 != 0x28) && (iVar3 != 0x5b)) {
      if (iVar3 == 0x5c) {
        (local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = CHAR;
        iVar3 = std::istream::get();
        if (iVar3 == -1) {
          std::__cxx11::string::string((string *)&oct,"Invalid character",(allocator *)&local_1c0);
          ParseResult::ParseResult(__return_storage_ptr__,&oct);
        }
        else {
          charname._M_string_length = 0;
          *charname._M_dataplus._M_p = '\0';
          std::__cxx11::string::push_back((char)&charname);
          iVar3 = std::istream::peek();
          while (bVar2 = is_delimiter(iVar3), !bVar2) {
            std::__cxx11::string::push_back((char)&charname);
            std::istream::get();
            iVar3 = std::istream::peek();
          }
          std::__cxx11::string::string((string *)&local_f0,(string *)&charname);
          normalize_char_name(&oct,&local_f0);
          std::__cxx11::string::operator=
                    ((string *)
                     &(local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      value,(string *)&oct);
          std::__cxx11::string::~string((string *)&oct);
          std::__cxx11::string::~string((string *)&local_f0);
          if (((local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value).
              _M_string_length != 0) {
            this = local_a8;
            goto LAB_00112d1e;
          }
          std::operator+(&oct,"Invalid character: #\\",&charname);
          ParseResult::ParseResult(__return_storage_ptr__,&oct);
        }
        goto LAB_00112a96;
      }
      if (iVar3 == 0x66) {
        (local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = BOOL;
        std::__cxx11::string::assign
                  ((char *)&(local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->value);
        this = local_98;
      }
      else {
        if (iVar3 != 0x74) {
          std::__cxx11::string::string
                    ((string *)&local_1c0,"Invalid sequence: #",(allocator *)&local_168);
          std::operator+(&oct,&local_1c0,(char)iVar3);
          ParseResult::ParseResult(__return_storage_ptr__,&oct);
          std::__cxx11::string::~string((string *)&oct);
          psVar8 = &local_1c0;
          goto LAB_00112a9b;
        }
        (local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = BOOL;
        std::__cxx11::string::assign
                  ((char *)&(local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->value);
        this = local_88;
      }
      break;
    }
    read_list((ParseResult *)&oct,is,&local_1d8,iVar3 == 0x5b);
    pPVar6 = ParseResult::operator=(&result,(ParseResult *)&oct);
    pVar1 = pPVar6->result;
    ParseResult::~ParseResult((ParseResult *)&oct);
    if (pVar1 != OK) goto LAB_00112a54;
    (local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = VECTOR;
    this = local_b8;
LAB_00112d1e:
    __return_storage_ptr__->result = OK;
    this->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this[-1]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    goto LAB_00112c57;
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x2a:
  case 0x2b:
    goto switchD_0011260d_caseD_24;
  case 0x27:
    std::__cxx11::string::string((string *)&local_1c0,"quote",(allocator *)&local_168);
    read_quoted((ParseResult *)&oct,is,&local_1d8,&local_1c0);
    pPVar6 = ParseResult::operator=(&result,(ParseResult *)&oct);
    pVar1 = pPVar6->result;
    ParseResult::~ParseResult((ParseResult *)&oct);
    std::__cxx11::string::~string((string *)&local_1c0);
    if (pVar1 != OK) {
LAB_00112a54:
      ParseResult::ParseResult(__return_storage_ptr__,&result);
      goto LAB_00112c6d;
    }
    this = local_58;
    break;
  case 0x28:
switchD_0011260d_caseD_28:
    read_list((ParseResult *)&oct,is,&local_1d8,iVar3 == 0x5b);
    pPVar6 = ParseResult::operator=(&result,(ParseResult *)&oct);
    pVar1 = pPVar6->result;
    ParseResult::~ParseResult((ParseResult *)&oct);
    if (pVar1 != OK) goto LAB_00112a54;
    this = local_48;
    break;
  case 0x29:
switchD_0011260d_caseD_29:
    std::__cxx11::string::string((string *)&oct,"Invalid syntax",(allocator *)&local_1c0);
    ParseResult::ParseResult(__return_storage_ptr__,&oct);
LAB_00112a96:
    psVar8 = &oct;
LAB_00112a9b:
    std::__cxx11::string::~string((string *)psVar8);
    goto LAB_00112c6d;
  case 0x2c:
    iVar3 = std::istream::peek();
    if (iVar3 == 0x40) {
      std::istream::get();
      std::__cxx11::string::string((string *)&local_1c0,"unquote-splicing",(allocator *)&local_168);
      read_quoted((ParseResult *)&oct,is,&local_1d8,&local_1c0);
    }
    else {
      std::__cxx11::string::string((string *)&local_1c0,"unquote",(allocator *)&local_168);
      read_quoted((ParseResult *)&oct,is,&local_1d8,&local_1c0);
    }
    pPVar6 = ParseResult::operator=(&result,(ParseResult *)&oct);
    pVar1 = pPVar6->result;
    ParseResult::~ParseResult((ParseResult *)&oct);
    std::__cxx11::string::~string((string *)&local_1c0);
    if (pVar1 != OK) goto LAB_00112a54;
    this = local_78;
    break;
  default:
    if (iVar3 == -1) {
      __return_storage_ptr__->result = END;
      (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->error)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error).field_2;
      (__return_storage_ptr__->error)._M_string_length = 0;
      (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
      goto LAB_00112c6d;
    }
    if (iVar3 == 0x5b) goto switchD_0011260d_caseD_28;
    if (iVar3 == 0x5d) goto switchD_0011260d_caseD_29;
    if (iVar3 == 0x60) {
      std::__cxx11::string::string((string *)&local_1c0,"quasiquote",(allocator *)&local_168);
      read_quoted((ParseResult *)&oct,is,&local_1d8,&local_1c0);
      pPVar6 = ParseResult::operator=(&result,(ParseResult *)&oct);
      pVar1 = pPVar6->result;
      ParseResult::~ParseResult((ParseResult *)&oct);
      std::__cxx11::string::~string((string *)&local_1c0);
      if (pVar1 != OK) goto LAB_00112a54;
      this = local_68;
      break;
    }
    goto switchD_0011260d_caseD_24;
  }
LAB_00112ac7:
  __return_storage_ptr__->result = OK;
  this->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this[-1]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
LAB_00112c57:
  local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->error)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).field_2;
  (__return_storage_ptr__->error)._M_string_length = 0;
  (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
LAB_00112c6d:
  ParseResult::~ParseResult(&result);
  std::__cxx11::string::~string((string *)&charname);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
switchD_0011260d_caseD_24:
  cVar7 = (char)local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  tolower(iVar3);
  std::__cxx11::string::push_back(cVar7 + '\b');
  iVar3 = std::istream::peek();
  while( true ) {
    bVar2 = is_delimiter(iVar3);
    psVar8 = &(local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value;
    if (bVar2) break;
    tolower(iVar3);
    std::__cxx11::string::push_back((char)psVar8);
    std::istream::get();
    iVar3 = std::istream::peek();
  }
  aVar5 = identifier_type(psVar8);
  (local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type = aVar5;
  this = local_c8;
  __return_storage_ptr__->result = OK;
  local_c8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d0 = 0;
  (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = local_1d8.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  goto LAB_00112c57;
LAB_00112a69:
  this = &local_38;
  goto LAB_00112ac7;
}

Assistant:

ParseResult read_object(std::istream &is)
{
    auto o = std::make_shared<ASTNode>();
    skip_whitespace(is);
    int c = is.get();
    std::string charname;
    ParseResult result;
    switch(c)
    {
        case EOF:
            return ParseResult();
        case ')':
        case ']':
            return ParseResult("Invalid syntax");
        case '"':
            o->type = ast_type_t::STRING;
            c = is.get();
            while(c != EOF && c != '"')
            {
                if(c == '\\')
                {
                    c = is.get();
                    if(c == 'n')
                        o->value.push_back('\n');
                    else if(c == 't')
                        o->value.push_back('\t');
                    else if(c == 'f')
                        o->value.push_back('\f');
                    else if('0' <= c && c <= '7')
                    {
                        std::string oct;
                        for(int i = 0; i < 2; ++i)
                        {
                            oct.push_back(c);
                            c = is.get();
                            if(!('0' <= c && c <= '7'))
                                return ParseResult("Invalid escape sequence: \\" + oct + char(c));
                        }
                        oct.push_back(c);
                        o->value.push_back(parse_oct_char(oct));
                    }
                    else
                        o->value.push_back(c);
                }
                else
                    o->value.push_back(c);
                c = is.get();
            }
            if(c == EOF)
                return ParseResult("Unclosed string literal");
            return o;
        case '(':
        case '[':
            if((result = read_list(is, o, c == '[')).result != parse_result_t::OK)
                return result;
            return o;
        case '\'':
            if((result = read_quoted(is, o, "quote")).result != parse_result_t::OK)
                return result;
            return o;
        case '`':
            if((result = read_quoted(is, o, "quasiquote")).result != parse_result_t::OK)
                return result;
            return o;
        case ',':
            if(is.peek() == '@')
            {
                is.get();
                if((result = read_quoted(is, o, "unquote-splicing")).result != parse_result_t::OK)
                    return result;
            }
            else
            {
                if((result = read_quoted(is, o, "unquote")).result != parse_result_t::OK)
                    return result;
            }
            return o;
        case '#':
            c = tolower(is.get());
            switch(c)
            {
                case 't':
                    o->type = ast_type_t::BOOL;
                    o->value = "t";
                    return o;
                case 'f':
                    o->type = ast_type_t::BOOL;
                    o->value = "f";
                    return o;
                case '\\':
                    o->type = ast_type_t::CHAR;
                    c = is.get();
                    if(c == EOF)
                        return ParseResult("Invalid character");
                    charname.clear();
                    charname.push_back(c);
                    c = is.peek();
                    while(!is_delimiter(c))
                    {
                        charname.push_back(c);
                        is.get();
                        c = is.peek();
                    }
                    o->value = normalize_char_name(charname);
                    if(o->value.empty())
                        return ParseResult("Invalid character: #\\" + charname);
                    return o;
                case '(':
                case '[':
                    if((result = read_list(is, o, c == '[')).result != parse_result_t::OK)
                        return result;
                    o->type = ast_type_t::VECTOR;
                    return o;
                case '!':
                    o->value = "#!";
                    c = is.get();
                    break;
                default:
                    return ParseResult(std::string("Invalid sequence: #") + char(c));
            }
        default:
            o->value.push_back(tolower(c));
            c = is.peek();
            while(!is_delimiter(c))
            {
                o->value.push_back(tolower(c));
                is.get();
                c = is.peek();
            }
            o->type = identifier_type(o->value);
            return o;
    }
}